

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O2

void __thiscall
QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[17],_QString>,_char>,_QString>::
~QStringBuilder(QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[17],_QString>,_char>,_QString>
                *this)

{
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&(this->b).d);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&(this->a).a.b.d);
  return;
}

Assistant:

~QStringBuilder() = default;